

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

tuple<int,_int> __thiscall Net::login(Net *this,longlong room,string *pass)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  ulong uVar4;
  reference pvVar5;
  long lVar6;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  undefined1 local_2d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  replys;
  string temp;
  stringstream local_298 [8];
  stringstream stream;
  int local_108 [4];
  string local_f8 [32];
  string local_d8 [8];
  string reply;
  __cxx11 local_a8 [32];
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [8];
  string request;
  string *pass_local;
  longlong room_local;
  Net *this_local;
  
  std::__cxx11::to_string(local_a8,(longlong)pass);
  std::operator+((char *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"LOGIN ");
  std::operator+(local_68,(char *)local_88);
  std::operator+(local_48,local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::string(local_d8);
  std::__cxx11::string::string(local_f8,(string *)local_48);
  send_with_retry((Net *)room,(string *)local_f8);
  std::__cxx11::string::~string(local_f8);
  if (*(int *)room == 0) {
    read_with_retry((Net *)room,(string *)local_d8);
    if (*(int *)room == 0) {
      _Var2 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_298,local_d8,_Var2);
      std::__cxx11::string::string
                ((string *)
                 &replys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2d0);
      while( true ) {
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_298,
                            (string *)
                            &replys.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,' ');
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
        if (!bVar1) break;
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2d0,
                      (value_type *)
                      &replys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2d0,0);
      lVar6 = std::__cxx11::string::find((char *)pvVar5,0x11771a);
      if (lVar6 == -1) {
        *(undefined4 *)room = 1;
        local_2dc = -1;
        std::make_tuple<int,int>(&this->closed,&local_2dc);
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2d0,1);
        local_2d4 = std::__cxx11::stoi(pvVar5,(size_t *)0x0,10);
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2d0,2);
        local_2d8 = std::__cxx11::stoi(pvVar5,(size_t *)0x0,10);
        std::make_tuple<int,int>(&this->closed,&local_2d4);
      }
      local_108[1] = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2d0);
      std::__cxx11::string::~string
                ((string *)
                 &replys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::stringstream::~stringstream(local_298);
    }
    else {
      local_108[0] = -1;
      std::make_tuple<int,int>(&this->closed,local_108);
      local_108[1] = 1;
    }
  }
  else {
    local_108[3] = 0xffffffff;
    local_108[2] = 0xffffffff;
    std::make_tuple<int,int>(&this->closed,local_108 + 3);
    local_108[1] = 1;
  }
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string((string *)local_48);
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int,int> Net::login(long long room,std::string pass){
	std::string request="LOGIN "+std::to_string(room)+" PASSWORD "+pass;
	std::string reply;
	send_with_retry(request);
	if(closed)return std::make_tuple<int,int>(-1,-1);
	read_with_retry(reply);
	if(closed)return std::make_tuple<int,int>(-1,-1);

	std::stringstream stream(reply);
	std::string temp;
	std::vector<std::string> replys;
	while(std::getline(stream,temp,' ')){
		if(!temp.empty()){
			replys.push_back(temp);
		}
	}
	if(replys[0].find("SUCCESS")!=std::string::npos){
		return std::make_tuple<int,int>(std::stoi(replys[1]),std::stoi(replys[2]));
	}
	closed=1;
	return std::make_tuple<int,int>(-1,-1);
}